

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<char>::swap(SmallVectorImpl<char> *this,SmallVectorImpl<char> *RHS)

{
  undefined1 uVar1;
  SmallVectorImpl<char> *pSVar2;
  SmallVectorImpl<char> *pSVar3;
  void *pvVar4;
  void *pvVar5;
  void *__tmp;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  if (this != RHS) {
    pSVar2 = (SmallVectorImpl<char> *)
             (this->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    if ((pSVar2 == this + 1) ||
       (pSVar3 = (SmallVectorImpl<char> *)
                 (RHS->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
       pSVar3 == RHS + 1)) {
      uVar7 = (RHS->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if ((this->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar7) {
        SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,(ulong)uVar7,1);
      }
      uVar7 = (this->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      uVar6 = (ulong)uVar7;
      if ((RHS->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar7) {
        SmallVectorBase::grow_pod((SmallVectorBase *)RHS,RHS + 1,uVar6,1);
        uVar6 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      }
      uVar7 = (RHS->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      uVar12 = (ulong)uVar7;
      if ((uint)uVar6 < uVar7) {
        uVar12 = uVar6;
      }
      uVar11 = (uint)uVar12;
      if (uVar11 != 0) {
        uVar6 = 0;
        do {
          if (((this->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size <= uVar6) ||
             ((RHS->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size <= uVar6)) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                          ,0x95,
                          "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                         );
          }
          pvVar4 = (this->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          pvVar5 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          uVar1 = *(undefined1 *)((long)pvVar4 + uVar6);
          *(undefined1 *)((long)pvVar4 + uVar6) = *(undefined1 *)((long)pvVar5 + uVar6);
          *(undefined1 *)((long)pvVar5 + uVar6) = uVar1;
          uVar6 = uVar6 + 1;
        } while (uVar12 != uVar6);
        uVar6 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        uVar7 = (RHS->super_SmallVectorTemplateBase<char,_true>).
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      }
      uVar8 = (uint)uVar6;
      uVar10 = (ulong)uVar7;
      if (uVar7 < uVar8) {
        lVar9 = uVar6 - uVar10;
        if (uVar11 != uVar8) {
          memcpy((void *)(uVar10 + (long)(RHS->super_SmallVectorTemplateBase<char,_true>).
                                         super_SmallVectorTemplateCommon<char,_void>.
                                         super_SmallVectorBase.BeginX),
                 (void *)((long)(this->super_SmallVectorTemplateBase<char,_true>).
                                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                BeginX + uVar12),uVar6 - uVar12);
          uVar10 = (ulong)(RHS->super_SmallVectorTemplateBase<char,_true>).
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        }
        uVar10 = lVar9 + uVar10;
        if (((RHS->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar10) ||
           ((RHS->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = (uint)uVar10,
           (this->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar11)) {
LAB_00d9b94e:
          __assert_fail("N <= capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                        ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
        }
        (this->super_SmallVectorTemplateBase<char,_true>).
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = uVar11;
      }
      else if (uVar8 < uVar7) {
        lVar9 = uVar10 - uVar6;
        if (uVar11 != uVar7) {
          memcpy((void *)(uVar6 + (long)(this->super_SmallVectorTemplateBase<char,_true>).
                                        super_SmallVectorTemplateCommon<char,_void>.
                                        super_SmallVectorBase.BeginX),
                 (void *)((long)(RHS->super_SmallVectorTemplateBase<char,_true>).
                                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                BeginX + uVar12),uVar10 - uVar12);
          uVar6 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        }
        uVar6 = lVar9 + uVar6;
        if (((this->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar6) ||
           ((this->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = (uint)uVar6,
           (RHS->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar11))
        goto LAB_00d9b94e;
        (RHS->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>
        .super_SmallVectorBase.Size = uVar11;
      }
    }
    else {
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX = pSVar3;
      (RHS->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX = pSVar2;
      uVar7 = (this->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size =
           (RHS->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      (RHS->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size = uVar7;
      uVar7 = (this->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity;
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity =
           (RHS->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity;
      (RHS->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity = uVar7;
    }
  }
  return;
}

Assistant:

void SmallVectorImpl<T>::swap(SmallVectorImpl<T> &RHS) {
  if (this == &RHS) return;

  // We can only avoid copying elements if neither vector is small.
  if (!this->isSmall() && !RHS.isSmall()) {
    std::swap(this->BeginX, RHS.BeginX);
    std::swap(this->Size, RHS.Size);
    std::swap(this->Capacity, RHS.Capacity);
    return;
  }
  if (RHS.size() > this->capacity())
    this->grow(RHS.size());
  if (this->size() > RHS.capacity())
    RHS.grow(this->size());

  // Swap the shared elements.
  size_t NumShared = this->size();
  if (NumShared > RHS.size()) NumShared = RHS.size();
  for (size_type i = 0; i != NumShared; ++i)
    std::swap((*this)[i], RHS[i]);

  // Copy over the extra elts.
  if (this->size() > RHS.size()) {
    size_t EltDiff = this->size() - RHS.size();
    this->uninitialized_copy(this->begin()+NumShared, this->end(), RHS.end());
    RHS.set_size(RHS.size() + EltDiff);
    this->destroy_range(this->begin()+NumShared, this->end());
    this->set_size(NumShared);
  } else if (RHS.size() > this->size()) {
    size_t EltDiff = RHS.size() - this->size();
    this->uninitialized_copy(RHS.begin()+NumShared, RHS.end(), this->end());
    this->set_size(this->size() + EltDiff);
    this->destroy_range(RHS.begin()+NumShared, RHS.end());
    RHS.set_size(NumShared);
  }
}